

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# form.cpp
# Opt level: O3

void __thiscall cppcms::widgets::textarea::textarea(textarea *this)

{
  base_widget::base_widget((base_widget *)&(this->super_base_text).field_0x58);
  (this->super_base_text).value_._M_dataplus._M_p = (pointer)&(this->super_base_text).value_.field_2
  ;
  (this->super_base_text).value_._M_string_length = 0;
  (this->super_base_text).value_.field_2._M_local_buf[0] = '\0';
  (this->super_base_text).low_ = 0;
  (this->super_base_text).high_ = -1;
  (this->super_base_text).validate_charset_ = true;
  (this->super_base_text).d.ptr_ = (_data *)0x0;
  (this->super_base_text)._vptr_base_text = (_func_int **)0x286a10;
  *(undefined8 *)&(this->super_base_text).field_0x58 = 0x286a90;
  *(undefined8 *)&(this->super_base_text).field_0x48 = 0xffffffffffffffff;
  *(undefined8 *)&(this->super_base_text).field_0x50 = 0;
  return;
}

Assistant:

base_text::base_text() : low_(0),high_(-1),validate_charset_(true)
{
}